

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSiteObject.h
# Opt level: O1

BOOL __thiscall
Js::CrossSiteObject<Js::SpreadArgument>::SetAccessors
          (CrossSiteObject<Js::SpreadArgument> *this,PropertyId propertyId,Var getter,Var setter,
          PropertyOperationFlags flags)

{
  if (getter != (Var)0x0) {
    CrossSite::MarshalVar
              ((((((this->super_SpreadArgument).super_DynamicObject.super_RecyclableObject.type.ptr)
                 ->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr,getter,
               false);
  }
  if (setter != (Var)0x0) {
    CrossSite::MarshalVar
              ((((((this->super_SpreadArgument).super_DynamicObject.super_RecyclableObject.type.ptr)
                 ->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr,setter,
               false);
  }
  SpreadArgument::AssertAndFailFast(&this->super_SpreadArgument);
  return 0;
}

Assistant:

BOOL CrossSiteObject<T>::SetAccessors(PropertyId propertyId, Var getter, Var setter, PropertyOperationFlags flags)
    {
        if (getter != nullptr)
        {
            getter = CrossSite::MarshalVar(this->GetScriptContext(), getter);
        }
        if (setter != nullptr)
        {
            setter = CrossSite::MarshalVar(this->GetScriptContext(), setter);
        }
        return __super::SetAccessors(propertyId, getter, setter, flags);
    }